

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.hpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
TasGrid::MultiIndexManipulations::generateLevelWeightsCache<double,(TasGrid::TypeDepth)3,false>
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,MultiIndexManipulations *this,ProperWeights *weights,
          function<int_(int)> *rule_exactness,int offset)

{
  vector<double,std::allocator<double>> *pvVar1;
  long lVar2;
  iterator iVar3;
  double dVar4;
  undefined8 uVar5;
  size_type __n;
  ulong uVar6;
  long lVar7;
  double w;
  vector<int,_std::allocator<int>_> exactness_cache;
  undefined8 local_80;
  vector<int,_std::allocator<int>_> local_78;
  double local_58;
  int local_50;
  int local_4c;
  long local_48;
  MultiIndexManipulations *local_40;
  double local_38;
  
  local_58 = (double)CONCAT44(local_58._4_4_,(int)rule_exactness);
  lVar7 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  __n = lVar2 - lVar7 >> 2;
  local_40 = this;
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)__return_storage_ptr__,__n,(allocator_type *)&local_78);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_80 = (double)((ulong)local_80._4_4_ << 0x20);
  ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_78,(iterator)0x0,(int *)&local_80);
  if (lVar2 != lVar7) {
    local_38 = (double)local_58._0_4_;
    local_48 = __n + (__n == 0);
    lVar7 = 0;
    do {
      local_58 = *(double *)(*(long *)(local_40 + 0x20) + lVar7 * 8);
      local_80 = 1.0;
      pvVar1 = (vector<double,std::allocator<double>> *)
               ((__return_storage_ptr__->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar7);
      iVar3._M_current = *(double **)(pvVar1 + 8);
      if (iVar3._M_current == *(double **)(pvVar1 + 0x10)) {
        ::std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (pvVar1,iVar3,(double *)&local_80);
      }
      else {
        *iVar3._M_current = 1.0;
        *(double **)(pvVar1 + 8) = iVar3._M_current + 1;
      }
      uVar6 = 1;
      do {
        if ((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar6) {
          local_4c = (int)uVar6 + -1;
          if ((weights->linear).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish == (pointer)0x0) {
            uVar5 = ::std::__throw_bad_function_call();
            if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            ::std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)__return_storage_ptr__);
            _Unwind_Resume(uVar5);
          }
          local_50 = (*(code *)(weights->linear).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage)(weights,&local_4c)
          ;
          local_50 = local_50 + 1;
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_50);
          }
          else {
            *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_50;
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        local_80 = pow((double)(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar6] + 1),local_58);
        pvVar1 = (vector<double,std::allocator<double>> *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar7);
        iVar3._M_current = *(double **)(pvVar1 + 8);
        if (iVar3._M_current == *(double **)(pvVar1 + 0x10)) {
          ::std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar1,iVar3,(double *)&local_80);
        }
        else {
          *iVar3._M_current = local_80;
          *(double **)(pvVar1 + 8) = iVar3._M_current + 1;
        }
        dVar4 = ceil(local_80);
        uVar6 = uVar6 + 1;
      } while (dVar4 <= local_38);
      lVar7 = lVar7 + 1;
    } while (lVar7 != local_48);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<CacheType>> generateLevelWeightsCache(ProperWeights const &weights, std::function<int(int i)> rule_exactness, int offset){
    size_t num_dimensions = weights.getNumDimensions();
    std::vector<std::vector<CacheType>> cache(num_dimensions);
    std::vector<int> exactness_cache;

    // if we know the sized here, then assign, otherwise dynamically build later
    if (isotropic){
        for(auto &vec : cache) vec.reserve((size_t) offset);
        exactness_cache.resize((size_t) offset);
        exactness_cache[0] = 0;
        for(int i=1; i<offset; i++)
            exactness_cache[i] = 1 + rule_exactness(i - 1);
    }else{
        exactness_cache.push_back(0); // exactness always starts from 0
    }

    for(size_t j=0; j<num_dimensions; j++){
        int wl = weights.linear[j]; // linear weights
        double wc = (contour == type_level) ? 0.0 : weights.curved[j]; // curved weights

        size_t i = 0; // keep track of the index
        CacheType w = (CacheType) ((contour == type_hyperbolic) ? 1 : 0);
        cache[j].push_back(w); // initial entry
        do{ // accumulate the cache
            i++;
            if (!isotropic && (i >= exactness_cache.size()))
                exactness_cache.push_back(1 + rule_exactness((int)(i - 1)));

            int e = exactness_cache[i];

            if (contour == type_level){
                w = (CacheType)(wl * e);
            }else if (contour == type_curved){
                w = (CacheType)(wl * e) + (CacheType)(wc * std::log1p((CacheType)e));
            }else{ // must be hyperbolic
                w = (CacheType)(pow((CacheType) (1 + e), wc));
            }

            cache[j].push_back(w);
        // isotropic mode works until offset, anisotropic mode works until weight reaches the offset
        }while( (!isotropic && (std::ceil(w) <= (CacheType) offset)) || (isotropic && (i + 1 < (size_t) offset)) );
    }

    return cache;
}